

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

double __thiscall ON_Font::HeightScale(ON_Font *this,double text_height)

{
  ON_FontGlyphCache *pOVar1;
  ON_FontMetrics *pOVar2;
  double dVar3;
  
  pOVar1 = FontGlyphCache(this,false);
  if (pOVar1 == (ON_FontGlyphCache *)0x0) {
    pOVar2 = &ON_FontMetrics::Unset;
  }
  else {
    pOVar2 = &pOVar1->m_normalized_metrics;
  }
  if (pOVar2->m_ascent_of_capital == 0) {
    dVar3 = 1.0;
  }
  else {
    dVar3 = text_height / (double)pOVar2->m_ascent_of_capital;
  }
  return (double)(~-(ulong)(0.0 < text_height) & 0x3ff0000000000000 |
                 (~-(ulong)(text_height < 1.2343210235867887e+38) & 0x3ff0000000000000 |
                 (ulong)dVar3 & -(ulong)(text_height < 1.2343210235867887e+38)) &
                 -(ulong)(0.0 < text_height));
}

Assistant:

double ON_Font::HeightScale(double text_height) const
{
  return FontMetrics().GlyphScale(text_height);
}